

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord.cc
# Opt level: O0

void __thiscall
absl::lts_20240722::Cord::InlineRep::PrependTree
          (InlineRep *this,Nonnull<CordRep_*> tree,MethodIdentifier method)

{
  bool bVar1;
  MethodIdentifier method_local;
  Nonnull<CordRep_*> tree_local;
  InlineRep *this_local;
  
  if (tree == (Nonnull<CordRep_*>)0x0) {
    __assert_fail("tree != nullptr",
                  "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/absl-src/absl/strings/cord.cc"
                  ,0x100,
                  "void absl::Cord::InlineRep::PrependTree(absl::Nonnull<CordRep *>, MethodIdentifier)"
                 );
  }
  if (tree->length != 0) {
    bVar1 = cord_internal::CordRep::IsCrc(tree);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      __assert_fail("!tree->IsCrc()",
                    "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/absl-src/absl/strings/cord.cc"
                    ,0x102,
                    "void absl::Cord::InlineRep::PrependTree(absl::Nonnull<CordRep *>, MethodIdentifier)"
                   );
    }
    bVar1 = cord_internal::InlineData::is_tree(&this->data_);
    if (bVar1) {
      PrependTreeToTree(this,tree,method);
    }
    else {
      PrependTreeToInlined(this,tree,method);
    }
    return;
  }
  __assert_fail("tree->length != 0",
                "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/absl-src/absl/strings/cord.cc"
                ,0x101,
                "void absl::Cord::InlineRep::PrependTree(absl::Nonnull<CordRep *>, MethodIdentifier)"
               );
}

Assistant:

void Cord::InlineRep::PrependTree(absl::Nonnull<CordRep*> tree,
                                  MethodIdentifier method) {
  assert(tree != nullptr);
  assert(tree->length != 0);
  assert(!tree->IsCrc());
  if (data_.is_tree()) {
    PrependTreeToTree(tree, method);
  } else {
    PrependTreeToInlined(tree, method);
  }
}